

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itread.c
# Opt level: O1

int it_read_envelope(IT_ENVELOPE *envelope,DUMBFILE *f)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  byte bVar5;
  ulong uVar6;
  
  iVar2 = dumbfile_getc(f);
  envelope->flags = (uchar)iVar2;
  uVar3 = dumbfile_getc(f);
  envelope->n_nodes = (uchar)uVar3;
  if (0x19 < (uVar3 & 0xfe)) {
    envelope->n_nodes = '\0';
    return -1;
  }
  iVar2 = dumbfile_getc(f);
  envelope->loop_start = (uchar)iVar2;
  iVar2 = dumbfile_getc(f);
  envelope->loop_end = (uchar)iVar2;
  iVar2 = dumbfile_getc(f);
  envelope->sus_loop_start = (uchar)iVar2;
  iVar2 = dumbfile_getc(f);
  envelope->sus_loop_end = (uchar)iVar2;
  uVar4 = (ulong)envelope->n_nodes;
  if (envelope->n_nodes != 0) {
    uVar6 = 0;
    do {
      iVar2 = dumbfile_getc(f);
      envelope->node_y[uVar6] = (char)iVar2;
      iVar2 = dumbfile_igetw(f);
      envelope->node_t[uVar6] = (unsigned_short)iVar2;
      uVar6 = uVar6 + 1;
      uVar4 = (ulong)envelope->n_nodes;
    } while (uVar6 < uVar4);
  }
  dumbfile_skip(f,uVar4 * -3 + 0x4c);
  bVar1 = envelope->n_nodes;
  if (bVar1 == 0) {
    bVar5 = 0xfe;
  }
  else {
    if ((bVar1 <= envelope->loop_end) || (envelope->loop_end < envelope->loop_start)) {
      envelope->flags = envelope->flags & 0xfd;
    }
    bVar5 = 0xfb;
    if ((envelope->sus_loop_end < bVar1) && (envelope->sus_loop_start <= envelope->sus_loop_end))
    goto LAB_006f472f;
  }
  envelope->flags = envelope->flags & bVar5;
LAB_006f472f:
  iVar2 = dumbfile_error(f);
  return iVar2;
}

Assistant:

static int it_read_envelope(IT_ENVELOPE *envelope, DUMBFILE *f)
{
	int n;

	envelope->flags = dumbfile_getc(f);
	envelope->n_nodes = dumbfile_getc(f);
	if(envelope->n_nodes > 25) {
		TRACE("IT error: wrong number of envelope nodes (%d)\n", envelope->n_nodes);
		envelope->n_nodes = 0;
		return -1;
	}
	envelope->loop_start = dumbfile_getc(f);
	envelope->loop_end = dumbfile_getc(f);
	envelope->sus_loop_start = dumbfile_getc(f);
	envelope->sus_loop_end = dumbfile_getc(f);
	for (n = 0; n < envelope->n_nodes; n++) {
		envelope->node_y[n] = dumbfile_getc(f);
		envelope->node_t[n] = dumbfile_igetw(f);
	}
	dumbfile_skip(f, 75 - envelope->n_nodes * 3 + 1);

	if (envelope->n_nodes <= 0)
		envelope->flags &= ~IT_ENVELOPE_ON;
	else {
		if (envelope->loop_end >= envelope->n_nodes || envelope->loop_start > envelope->loop_end) envelope->flags &= ~IT_ENVELOPE_LOOP_ON;
		if (envelope->sus_loop_end >= envelope->n_nodes || envelope->sus_loop_start > envelope->sus_loop_end) envelope->flags &= ~IT_ENVELOPE_SUSTAIN_LOOP;
	}

	return dumbfile_error(f);
}